

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::HandleTestActionArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  undefined1 uVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  ostream *poVar7;
  string local_390 [32];
  undefined1 local_370 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_50 [8];
  string arg;
  bool success;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  char *ctestExec_local;
  cmCTest *this_local;
  
  arg.field_2._M_local_buf[0xf] = '\x01';
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,*i);
  std::__cxx11::string::string((string *)local_50,(string *)pvVar4);
  bVar3 = CheckArgument(this,(string *)local_50,"-T","--test-action");
  if ((bVar3) &&
     (uVar1 = *i,
     sVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args), uVar1 < sVar5 - 1)) {
    this->ProduceXML = true;
    *i = *i + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,*i);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar3 = SetTest(this,pcVar6,false);
    if (!bVar3) {
      arg.field_2._M_local_buf[0xf] = '\0';
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      poVar7 = std::operator<<((ostream *)local_1d8,"CTest -T called with incorrect option: ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      poVar7 = std::operator<<(poVar7,(string *)pvVar4);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x868,pcVar6,false);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
      poVar7 = std::operator<<((ostream *)local_370,"Available options are:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T all");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T start");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T update");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T configure");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T build");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T test");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T coverage");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T memcheck");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T notes");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T submit");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x874,pcVar6,false);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
    }
  }
  uVar2 = arg.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(uVar2 & 1);
}

Assistant:

bool cmCTest::HandleTestActionArgument(const char* ctestExec, size_t& i,
                                       const std::vector<std::string>& args)
{
  bool success = true;
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-T", "--test-action") &&
      (i < args.size() - 1)) {
    this->ProduceXML = true;
    i++;
    if (!this->SetTest(args[i].c_str(), false)) {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE, "CTest -T called with incorrect option: "
                   << args[i] << std::endl);
      cmCTestLog(this, ERROR_MESSAGE, "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -T all" << std::endl
                   << "  " << ctestExec << " -T start" << std::endl
                   << "  " << ctestExec << " -T update" << std::endl
                   << "  " << ctestExec << " -T configure" << std::endl
                   << "  " << ctestExec << " -T build" << std::endl
                   << "  " << ctestExec << " -T test" << std::endl
                   << "  " << ctestExec << " -T coverage" << std::endl
                   << "  " << ctestExec << " -T memcheck" << std::endl
                   << "  " << ctestExec << " -T notes" << std::endl
                   << "  " << ctestExec << " -T submit" << std::endl);
    }
  }
  return success;
}